

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void testing::internal::InsertSyntheticTestCase(string *name,CodeLocation *location,bool has_test_p)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  char *pcVar4;
  pointer pcVar5;
  UnitTestImpl *pUVar6;
  _func_int **pp_Var7;
  _func_int **pp_Var8;
  const_iterator cVar9;
  long *plVar10;
  TestFactoryBase *factory;
  size_type *psVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  long *plVar13;
  size_type __dnew;
  string message;
  string full_name;
  char kMissingTestCase [348];
  char kMissingInstantiation [378];
  allocator local_451;
  string local_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  CodeLocation local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  TestFactoryBase *local_3c8;
  undefined8 local_3c0;
  TestFactoryBase local_3b8;
  _func_int **pp_Stack_3b0;
  int local_3a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3a0;
  _func_int **local_398;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_390;
  TestFactoryBase *local_380;
  _func_int **local_378;
  TestFactoryBase local_370;
  _func_int **pp_Stack_368;
  int local_360;
  long *local_358;
  long local_350;
  long local_348;
  long lStack_340;
  long *local_338;
  long local_330;
  long local_328;
  long lStack_320;
  undefined1 local_318 [352];
  undefined1 local_1b8 [392];
  
  UnitTest::GetInstance();
  pUVar6 = UnitTest::GetInstance::instance.impl_;
  cVar9 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&((UnitTest::GetInstance::instance.impl_)->ignored_parameterized_test_suites_)._M_t
                 ,name);
  if ((_Rb_tree_header *)cVar9._M_node ==
      &(pUVar6->ignored_parameterized_test_suites_)._M_t._M_impl.super__Rb_tree_header) {
    memcpy(local_1b8,
           " is defined via TEST_P, but never instantiated. None of the test cases will run. Either no INSTANTIATE_TEST_SUITE_P is provided or the only ones provided expand to nothing.\n\nIdeally, TEST_P definitions should only ever be included as part of binaries that intend to use them. (As opposed to, for example, being placed in a library that may be linked in to get other utilities.)"
           ,0x17a);
    memcpy(local_318,
           " is instantiated via INSTANTIATE_TEST_SUITE_P, but no tests are defined via TEST_P . No test cases will run.\n\nIdeally, INSTANTIATE_TEST_SUITE_P should only ever be invoked from code that always depend on code that provides TEST_P. Failing to do so is often an indication of dead code, e.g. the last TEST_P was removed but the rest got left behind."
           ,0x15c);
    std::operator+(&local_430,"Parameterized test suite ",name);
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_430);
    psVar11 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_450.field_2._M_allocated_capacity = *psVar11;
      local_450.field_2._8_8_ = plVar10[3];
      local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
    }
    else {
      local_450.field_2._M_allocated_capacity = *psVar11;
      local_450._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_450._M_string_length = plVar10[1];
    *plVar10 = (long)psVar11;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_450);
    paVar1 = &local_410.file.field_2;
    psVar11 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_410.file.field_2._M_allocated_capacity = *psVar11;
      local_410.file.field_2._8_8_ = plVar10[3];
      local_410.file._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_410.file.field_2._M_allocated_capacity = *psVar11;
      local_410.file._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_410.file._M_string_length = plVar10[1];
    *plVar10 = (long)psVar11;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_410,(ulong)(name->_M_dataplus)._M_p);
    paVar2 = &local_3e8.field_2;
    paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 == paVar12) {
      local_3e8.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
      local_3e8.field_2._8_8_ = plVar10[3];
      local_3e8._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_3e8.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
      local_3e8._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_3e8._M_string_length = plVar10[1];
    *plVar10 = (long)paVar12;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_3e8);
    local_358 = &local_348;
    plVar13 = plVar10 + 2;
    if ((long *)*plVar10 == plVar13) {
      local_348 = *plVar13;
      lStack_340 = plVar10[3];
    }
    else {
      local_348 = *plVar13;
      local_358 = (long *)*plVar10;
    }
    local_350 = plVar10[1];
    *plVar10 = (long)plVar13;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e8._M_dataplus._M_p != paVar2) {
      operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410.file._M_dataplus._M_p != paVar1) {
      operator_delete(local_410.file._M_dataplus._M_p,
                      local_410.file.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_450._M_dataplus._M_p != &local_450.field_2) {
      operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_430._M_dataplus._M_p != &local_430.field_2) {
      operator_delete(local_430._M_dataplus._M_p,
                      CONCAT71(local_430.field_2._M_allocated_capacity._1_7_,
                               local_430.field_2._M_local_buf[0]) + 1);
    }
    std::operator+(&local_3e8,"UninstantiatedParameterizedTestSuite<",name);
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_3e8);
    local_338 = &local_328;
    plVar13 = plVar10 + 2;
    if ((long *)*plVar10 == plVar13) {
      local_328 = *plVar13;
      lStack_320 = plVar10[3];
    }
    else {
      local_328 = *plVar13;
      local_338 = (long *)*plVar10;
    }
    local_330 = plVar10[1];
    *plVar10 = (long)plVar13;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e8._M_dataplus._M_p != paVar2) {
      operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
    }
    plVar10 = local_338;
    pcVar4 = (location->file)._M_dataplus._M_p;
    iVar3 = location->line;
    local_3a0 = &local_390;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_3a0,local_358,local_350 + (long)local_358);
    pcVar5 = (location->file)._M_dataplus._M_p;
    local_380 = &local_370;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_380,pcVar5,pcVar5 + (location->file)._M_string_length);
    local_360 = location->line;
    local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
    local_3e8._M_dataplus._M_p = (pointer)0x16;
    local_450._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_450,(ulong)&local_3e8);
    local_450.field_2._M_allocated_capacity = (size_type)local_3e8._M_dataplus._M_p;
    builtin_strncpy(local_450._M_dataplus._M_p,"GoogleTestVerification",0x16);
    local_450._M_string_length = (size_type)local_3e8._M_dataplus._M_p;
    local_450._M_dataplus._M_p[(long)local_3e8._M_dataplus._M_p] = '\0';
    std::__cxx11::string::string((string *)&local_430,pcVar4,&local_451);
    local_410.file._M_dataplus._M_p = (pointer)&local_410.file.field_2;
    paVar1 = &local_430.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_430._M_dataplus._M_p == paVar1) {
      local_410.file.field_2._8_8_ = local_430.field_2._8_8_;
    }
    else {
      local_410.file._M_dataplus._M_p = local_430._M_dataplus._M_p;
    }
    local_410.file.field_2._M_allocated_capacity._1_7_ =
         local_430.field_2._M_allocated_capacity._1_7_;
    local_410.file.field_2._M_local_buf[0] = local_430.field_2._M_local_buf[0];
    local_410.file._M_string_length = local_430._M_string_length;
    local_430._M_string_length = 0;
    local_430.field_2._M_local_buf[0] = '\0';
    local_430._M_dataplus._M_p = (pointer)paVar1;
    local_410.line = iVar3;
    factory = (TestFactoryBase *)operator_new(0x50);
    pp_Var8 = local_378;
    pp_Var7 = local_398;
    if (local_3a0 == &local_390) {
      local_3e8.field_2._8_8_ = local_390._8_8_;
      local_3e8._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_3e8._M_dataplus._M_p = (pointer)local_3a0;
    }
    local_3e8.field_2._M_allocated_capacity._1_7_ = local_390._M_allocated_capacity._1_7_;
    local_3e8.field_2._M_local_buf[0] = local_390._M_local_buf[0];
    local_398 = (_func_int **)0x0;
    local_390._M_local_buf[0] = '\0';
    if (local_380 == &local_370) {
      pp_Stack_3b0 = pp_Stack_368;
      local_3c8 = &local_3b8;
    }
    else {
      local_3c8 = local_380;
    }
    local_3b8._vptr_TestFactoryBase._1_7_ = local_370._vptr_TestFactoryBase._1_7_;
    local_3b8._vptr_TestFactoryBase._0_1_ = local_370._vptr_TestFactoryBase._0_1_;
    local_378 = (_func_int **)0x0;
    local_370._vptr_TestFactoryBase._0_1_ = 0;
    local_3a8 = local_360;
    factory->_vptr_TestFactoryBase =
         (_func_int **)
         (
         _ZTVZN7testing12RegisterTestITpTnRiJEZNS_8internal23InsertSyntheticTestCaseERKNSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEENS2_12CodeLocationEbE3__0EEPNS_8TestInfoEPKcSG_SG_SG_SG_iT0_E11FactoryImpl
         + 0x10);
    factory[1]._vptr_TestFactoryBase = (_func_int **)(factory + 3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e8._M_dataplus._M_p == paVar2) {
      factory[3]._vptr_TestFactoryBase = (_func_int **)local_3e8.field_2._M_allocated_capacity;
      factory[4]._vptr_TestFactoryBase = (_func_int **)local_3e8.field_2._8_8_;
    }
    else {
      factory[1]._vptr_TestFactoryBase = (_func_int **)local_3e8._M_dataplus._M_p;
      factory[3]._vptr_TestFactoryBase = (_func_int **)local_3e8.field_2._M_allocated_capacity;
    }
    factory[2]._vptr_TestFactoryBase = pp_Var7;
    local_3e8._M_string_length = 0;
    local_3e8.field_2._M_allocated_capacity =
         (ulong)(uint7)local_390._M_allocated_capacity._1_7_ << 8;
    factory[5]._vptr_TestFactoryBase = (_func_int **)(factory + 7);
    if (local_3c8 == &local_3b8) {
      factory[7]._vptr_TestFactoryBase = local_3b8._vptr_TestFactoryBase;
      factory[8]._vptr_TestFactoryBase = pp_Stack_3b0;
    }
    else {
      factory[5]._vptr_TestFactoryBase = (_func_int **)local_3c8;
      factory[7]._vptr_TestFactoryBase = local_3b8._vptr_TestFactoryBase;
    }
    factory[6]._vptr_TestFactoryBase = pp_Var8;
    local_3c0 = 0;
    local_3b8._vptr_TestFactoryBase =
         (_func_int **)((ulong)local_370._vptr_TestFactoryBase._1_7_ << 8);
    *(int *)&factory[9]._vptr_TestFactoryBase = local_360;
    local_3e8._M_dataplus._M_p = (pointer)paVar2;
    local_3c8 = &local_3b8;
    local_3a0 = &local_390;
    local_380 = &local_370;
    MakeAndRegisterTestInfo
              (&local_450,(char *)plVar10,(char *)0x0,(char *)0x0,&local_410,
               &TypeIdHelper<testing::internal::(anonymous_namespace)::FailureTest>::dummy_,
               (SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,factory);
    if (local_3c8 != &local_3b8) {
      operator_delete(local_3c8,(long)local_3b8._vptr_TestFactoryBase + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e8._M_dataplus._M_p != paVar2) {
      operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410.file._M_dataplus._M_p != &local_410.file.field_2) {
      operator_delete(local_410.file._M_dataplus._M_p,
                      local_410.file.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_430._M_dataplus._M_p != paVar1) {
      operator_delete(local_430._M_dataplus._M_p,
                      CONCAT71(local_430.field_2._M_allocated_capacity._1_7_,
                               local_430.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_450._M_dataplus._M_p != &local_450.field_2) {
      operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
    }
    if (local_380 != &local_370) {
      operator_delete(local_380,
                      CONCAT71(local_370._vptr_TestFactoryBase._1_7_,
                               local_370._vptr_TestFactoryBase._0_1_) + 1);
    }
    if (local_3a0 != &local_390) {
      operator_delete(local_3a0,
                      CONCAT71(local_390._M_allocated_capacity._1_7_,local_390._M_local_buf[0]) + 1)
      ;
    }
    if (local_338 != &local_328) {
      operator_delete(local_338,local_328 + 1);
    }
    if (local_358 != &local_348) {
      operator_delete(local_358,local_348 + 1);
    }
  }
  return;
}

Assistant:

void InsertSyntheticTestCase(const std::string& name, CodeLocation location,
                             bool has_test_p) {
  const auto& ignored = *GetIgnoredParameterizedTestSuites();
  if (ignored.find(name) != ignored.end()) return;

  const char kMissingInstantiation[] =  //
      " is defined via TEST_P, but never instantiated. None of the test "
      "cases "
      "will run. Either no INSTANTIATE_TEST_SUITE_P is provided or the only "
      "ones provided expand to nothing."
      "\n\n"
      "Ideally, TEST_P definitions should only ever be included as part of "
      "binaries that intend to use them. (As opposed to, for example, being "
      "placed in a library that may be linked in to get other utilities.)";

  const char kMissingTestCase[] =  //
      " is instantiated via INSTANTIATE_TEST_SUITE_P, but no tests are "
      "defined via TEST_P . No test cases will run."
      "\n\n"
      "Ideally, INSTANTIATE_TEST_SUITE_P should only ever be invoked from "
      "code that always depend on code that provides TEST_P. Failing to do "
      "so is often an indication of dead code, e.g. the last TEST_P was "
      "removed but the rest got left behind.";

  std::string message =
      "Parameterized test suite " + name +
      (has_test_p ? kMissingInstantiation : kMissingTestCase) +
      "\n\n"
      "To suppress this error for this test suite, insert the following line "
      "(in a non-header) in the namespace it is defined in:"
      "\n\n"
      "GTEST_ALLOW_UNINSTANTIATED_PARAMETERIZED_TEST(" +
      name + ");";

  std::string full_name = "UninstantiatedParameterizedTestSuite<" + name + ">";
  RegisterTest(  //
      "GoogleTestVerification", full_name.c_str(),
      nullptr,  // No type parameter.
      nullptr,  // No value parameter.
      location.file.c_str(), location.line, [message, location] {
        return new FailureTest(location, message,
                               kErrorOnUninstantiatedParameterizedTest);
      });
}